

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParsePrefixExp(ParserImpl *this,PrefixExpType *type)

{
  TokenDetail *t;
  undefined8 uVar1;
  undefined8 uVar2;
  _Manager_type p_Var3;
  TokenDetail op;
  TokenDetail *pTVar4;
  ParseException *pPVar5;
  undefined4 uVar6;
  undefined4 *in_RDX;
  Lexer *local_60;
  long *local_58;
  Lexer *local_50;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  String *pSStack_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  
  NextToken((ParserImpl *)type);
  t = (TokenDetail *)(type + 2);
  if (type[8] == 0x28) {
    local_58 = (long *)0x0;
    local_48.number_ = 0.0;
    pSStack_40 = (String *)0x0;
    local_38 = 0;
    iStack_34 = 0;
    iStack_30 = 0x11e;
    op._28_4_ = uStack_2c;
    op.token_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&stack0xffffffffffffffb0,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)type,op,
             (int)&local_58);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    pTVar4 = NextToken((ParserImpl *)type);
    if (pTVar4->token_ != 0x29) {
      pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar5,"expect \')\'",t);
      __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    uVar6 = 0;
    if (in_RDX == (undefined4 *)0x0) goto LAB_0015ff9a;
  }
  else {
    if (type[8] != 0x115) {
      pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar5,"unexpect token here",t);
      __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    local_50 = (Lexer *)operator_new(0x30);
    local_50->state_ = (State *)&PTR__SyntaxTree_00199268;
    uVar1 = *(undefined8 *)(type + 4);
    uVar2 = *(undefined8 *)(type + 6);
    p_Var3 = *(_Manager_type *)(type + 8);
    local_50->module_ = (String *)t->field_0;
    *(undefined8 *)&(local_50->in_stream_).super__Function_base._M_functor = uVar1;
    *(undefined8 *)((long)&(local_50->in_stream_).super__Function_base._M_functor + 8) = uVar2;
    (local_50->in_stream_).super__Function_base._M_manager = p_Var3;
    (local_50->in_stream_)._M_invoker = (_Invoker_type)0x0;
    if (in_RDX == (undefined4 *)0x0) goto LAB_0015ff9a;
    uVar6 = 1;
  }
  *in_RDX = uVar6;
LAB_0015ff9a:
  local_60 = local_50;
  ParsePrefixExpTail(this,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          type,(PrefixExpType *)&local_60);
  if (local_60 != (Lexer *)0x0) {
    (*(code *)(local_60->state_->string_pool_)._M_t.
              super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
              super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
              super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExp(PrefixExpType *type = nullptr)
        {
            NextToken();
            if (current_.token_ != Token_Id && current_.token_ != '(')
                throw ParseException("unexpect token here", current_);

            std::unique_ptr<SyntaxTree> exp;

            if (current_.token_ == '(')
            {
                exp = ParseExp();
                if (NextToken().token_ != ')')
                    throw ParseException("expect ')'", current_);
                if (type) *type = PrefixExpType_Normal;
            }
            else
            {
                exp.reset(new Terminator(current_));
                if (type) *type = PrefixExpType_Var;
            }

            return ParsePrefixExpTail(std::move(exp), type);
        }